

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O0

event_queue_t * __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
::bind_agent_with_inidividual_fifo
          (dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
           *this,agent_ref_t *agent,bind_params_t *params)

{
  prefix_t *data_source_name_prefix;
  agent_t *agent_ptr;
  agent_queue_t *paVar1;
  intrusive_ptr_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> local_58;
  agent_data_t local_50 [2];
  agent_t *local_30;
  undefined1 local_28 [8];
  agent_queue_ref_t queue;
  bind_params_t *params_local;
  agent_ref_t *agent_local;
  dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
  *this_local;
  
  queue.m_obj = (agent_queue_t *)params;
  make_new_agent_queue
            ((dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
              *)local_28,(bind_params_t *)this);
  local_30 = intrusive_ptr_t<so_5::agent_t>::get(agent);
  intrusive_ptr_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>::intrusive_ptr_t
            (&local_58,(intrusive_ptr_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *)local_28
            );
  data_source_name_prefix = reuse::thread_pool_stats::data_source_t::prefix(&this->m_data_source);
  agent_ptr = intrusive_ptr_t<so_5::agent_t>::get(agent);
  agent_data_t::agent_data_t(local_50,&local_58,data_source_name_prefix,agent_ptr);
  std::
  map<so_5::agent_t*,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::agent_data_t,std::less<so_5::agent_t*>,std::allocator<std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::agent_data_t>>>
  ::
  emplace<so_5::agent_t*,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::agent_data_t>
            ((map<so_5::agent_t*,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::agent_data_t,std::less<so_5::agent_t*>,std::allocator<std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::agent_data_t>>>
              *)&this->m_agents,&local_30,local_50);
  agent_data_t::~agent_data_t(local_50);
  intrusive_ptr_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>::~intrusive_ptr_t(&local_58);
  paVar1 = intrusive_ptr_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>::get
                     ((intrusive_ptr_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *)local_28)
  ;
  intrusive_ptr_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>::~intrusive_ptr_t
            ((intrusive_ptr_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *)local_28);
  return &paVar1->super_event_queue_t;
}

Assistant:

event_queue_t *
		bind_agent_with_inidividual_fifo(
			agent_ref_t agent,
			const PARAMS & params )
			{
				auto queue = make_new_agent_queue( params );

				m_agents.emplace(
						agent.get(),
						agent_data_t{
								queue,
								m_data_source.prefix(),
								agent.get() } );

				return queue.get();
			}